

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_digests.c
# Opt level: O2

int lookup(h2o_cache_digests_frame_vector_t *vector,char *url,size_t url_len,char *etag,
          size_t etag_len,int is_fresh,int is_complete)

{
  h2o_cache_digests_frame_t *phVar1;
  void *pvVar2;
  long lVar3;
  size_t sVar4;
  ulong local_c0 [4];
  SHA256_CTX ctx;
  
  if (vector->size != 0) {
    SHA256_Init((SHA256_CTX *)&ctx);
    SHA256_Update((SHA256_CTX *)&ctx,url,url_len);
    SHA256_Update((SHA256_CTX *)&ctx,etag,etag_len);
    SHA256_Final((uchar *)local_c0,(SHA256_CTX *)&ctx);
    lVar3 = 0;
    sVar4 = 0;
    do {
      phVar1 = vector->entries;
      ctx.h._0_8_ = (local_c0[0] >> 0x38 | (local_c0[0] & 0xff000000000000) >> 0x28 |
                     (local_c0[0] & 0xff0000000000) >> 0x18 | (local_c0[0] & 0xff00000000) >> 8 |
                     (local_c0[0] & 0xff000000) << 8 | (local_c0[0] & 0xff0000) << 0x18 |
                     (local_c0[0] & 0xff00) << 0x28 | local_c0[0] << 0x38) >>
                    (-*(char *)((long)&phVar1->capacity_bits + lVar3) & 0x3fU);
      pvVar2 = *(void **)((long)&(phVar1->keys).entries + lVar3);
      if ((pvVar2 != (void *)0x0) &&
         (pvVar2 = bsearch(&ctx,pvVar2,*(size_t *)((long)&(phVar1->keys).size + lVar3),8,cmp_key),
         pvVar2 != (void *)0x0)) {
        return 2;
      }
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (sVar4 != vector->size);
  }
  return (uint)(is_fresh != 0);
}

Assistant:

static int lookup(h2o_cache_digests_frame_vector_t *vector, const char *url, size_t url_len, const char *etag, size_t etag_len,
                  int is_fresh, int is_complete)
{
    if (vector->size != 0) {
        uint64_t hash = calc_hash(url, url_len, etag, etag_len);
        size_t i = 0;
        do {
            h2o_cache_digests_frame_t *frame = vector->entries + i;
            uint64_t key = hash >> (64 - frame->capacity_bits);
            if (frame->keys.entries != NULL &&
                bsearch(&key, frame->keys.entries, frame->keys.size, sizeof(frame->keys.entries[0]), cmp_key) != NULL)
                return is_fresh ? H2O_CACHE_DIGESTS_STATE_FRESH : H2O_CACHE_DIGESTS_STATE_STALE;
        } while (++i != vector->size);
    }

    return is_complete ? H2O_CACHE_DIGESTS_STATE_NOT_CACHED : H2O_CACHE_DIGESTS_STATE_UNKNOWN;
}